

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcdgen.h
# Opt level: O0

void __thiscall VcdGen::Signal::Signal(Signal *this,string *name,uint32_t width)

{
  uint32_t index;
  VcdGen *this_00;
  string local_40;
  uint32_t local_1c;
  string *psStack_18;
  uint32_t width_local;
  string *name_local;
  Signal *this_local;
  
  local_1c = width;
  psStack_18 = name;
  name_local = &this->name_;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->width_ = local_1c;
  std::__cxx11::string::string((string *)&this->encoded_name_);
  this_00 = (VcdGen *)(ulong)(uint)signal_count_;
  signal_count_ = signal_count_ + 1;
  encode_signal_name_abi_cxx11_(&local_40,this_00,index);
  std::__cxx11::string::operator=((string *)&this->encoded_name_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

Signal(string name, uint32_t width) 
    : name_(name), width_(width) {  

        encoded_name_ =  encode_signal_name(signal_count_++);
        #ifdef VCDGEN_DEBUG
            cout << "Init Signal " << name_ << " Encoded Name " << encoded_name_ << endl;
        #endif
    }